

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_impl.c
# Opt level: O2

void compress_view(uint8_t *dst,picnic_instance_t *pp,view_t *views,uint idx)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  uint64_t *puVar6;
  uint num_bits;
  ulong uVar7;
  bitstream_t bs;
  
  bVar1 = (pp->lowmc).r;
  bs.position = 0;
  uVar4 = (ulong)(pp->lowmc).m;
  bs.buffer.w = dst;
  if (uVar4 == 10) {
    for (lVar5 = 0; (uint)bVar1 * 0x60 != (int)lVar5; lVar5 = lVar5 + 0x60) {
      bitstream_put_bits(&bs,*(ulong *)((long)views + lVar5 + (ulong)idx * 8) >> 0x22,0x1e);
    }
  }
  else {
    uVar2 = (pp->lowmc).n;
    uVar4 = uVar4 * 3;
    num_bits = (uint)uVar4 & 0x3f;
    for (uVar3 = 0; uVar3 != bVar1; uVar3 = uVar3 + 1) {
      puVar6 = (uint64_t *)((long)views + ((ulong)(uVar2 + 0x3f >> 6) - 1) * 8 + (ulong)idx * 0x20);
      for (uVar7 = uVar4; 0x3f < uVar7; uVar7 = uVar7 - 0x40) {
        bitstream_put_bits(&bs,*puVar6,0x40);
        puVar6 = puVar6 + -1;
      }
      if ((ulong)num_bits != 0) {
        bitstream_put_bits(&bs,*puVar6 >> (0x40 - (ulong)num_bits & 0x3f),num_bits);
      }
      views = views + 1;
    }
  }
  return;
}

Assistant:

static void compress_view(uint8_t* dst, const picnic_instance_t* pp, const view_t* views,
                          const unsigned int idx) {
  const unsigned int num_views = pp->lowmc.r;

  bitstream_t bs;
  bs.buffer.w = dst;
  bs.position = 0;

  const view_t* v = &views[0];
#if defined(WITH_LOWMC_129_129_4) || defined(WITH_LOWMC_192_192_4) || defined(WITH_LOWMC_255_255_4)
  if (pp->lowmc.m != 10) {
    const unsigned int view_round_size = pp->lowmc.m * 3;
    const unsigned int width           = (pp->lowmc.n + 63) / 64;

    for (unsigned int i = 0; i < num_views; ++i, ++v) {
      mzd_to_bitstream(&bs, &v->s[idx], width, view_round_size);
    }
    return;
  }
#endif
  // clang-format off
#if defined(WITH_LOWMC_128_128_20) || defined(WITH_LOWMC_192_192_30) || defined(WITH_LOWMC_256_256_38)
  // clang-format on
  if (pp->lowmc.m == 10) {
    for (unsigned int i = 0; i < num_views; ++i, ++v) {
      uint64_to_bitstream_10(&bs, v->t[idx]);
    }
    return;
  }
#endif
  UNREACHABLE;
}